

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<kj::Own<CallResultHolder>_>::get
          (ForkBranch<kj::Own<CallResultHolder>_> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::Own<CallResultHolder>_> *pEVar1;
  Maybe<kj::Own<CallResultHolder>_> local_58;
  Own<CallResultHolder> local_48;
  Maybe<kj::Own<CallResultHolder>_> local_38;
  Own<CallResultHolder> *local_28;
  Own<CallResultHolder> *value;
  ExceptionOr<kj::Own<CallResultHolder>_> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<kj::Own<CallResultHolder>_> *this_local;
  
  hubResult = (ExceptionOr<kj::Own<CallResultHolder>_> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  value = (Own<CallResultHolder> *)
          ExceptionOrValue::
          as<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
                    (this_00);
  local_28 = readMaybe<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>
                       (&((ExceptionOr<kj::Own<CallResultHolder>_> *)value)->value);
  if (local_28 == (Own<CallResultHolder> *)0x0) {
    Maybe<kj::Own<CallResultHolder>_>::Maybe(&local_58,(void *)0x0);
    pEVar1 = ExceptionOrValue::
             as<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<kj::Own<CallResultHolder>_>::operator=(&pEVar1->value,&local_58);
    Maybe<kj::Own<CallResultHolder>_>::~Maybe(&local_58);
  }
  else {
    copyOrAddRef<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>
              ((_ *)&local_48,local_28);
    Maybe<kj::Own<CallResultHolder>_>::Maybe(&local_38,&local_48);
    pEVar1 = ExceptionOrValue::
             as<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<kj::Own<CallResultHolder>_>::operator=(&pEVar1->value,&local_38);
    Maybe<kj::Own<CallResultHolder>_>::~Maybe(&local_38);
    Own<CallResultHolder>::~Own(&local_48);
  }
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)value);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }